

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_7,_7>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  float *pfVar2;
  undefined8 *puVar3;
  Vec4 **ppVVar4;
  long lVar5;
  undefined4 *puVar6;
  float *pfVar7;
  long lVar8;
  long lVar9;
  undefined4 uVar10;
  Type in0;
  float afStack_a8 [6];
  Vec4 *local_90;
  int local_88 [4];
  Vector<float,_3> res;
  Vec4 *local_68;
  undefined8 uStack_60;
  float fStack_54;
  float fStack_50;
  undefined8 uStack_48;
  Matrix<float,_4,_2> retVal;
  Type in1;
  
  pfVar1 = retVal.m_data.m_data[1].m_data + 2;
  pfVar2 = retVal.m_data.m_data[1].m_data + 2;
  pfVar7 = retVal.m_data.m_data[1].m_data + 2;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar5 = 0;
    lVar8 = 0;
    do {
      lVar9 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar5 != lVar9) {
          uVar10 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar9) = uVar10;
        lVar9 = lVar9 + 0x10;
      } while (lVar9 == 0x10);
      lVar8 = lVar8 + 1;
      pfVar1 = (float *)((long)pfVar1 + 4);
      lVar5 = lVar5 + 0x10;
    } while (lVar8 != 4);
    retVal.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)evalCtx->in[0].m_data;
  }
  else {
    retVal.m_data.m_data[1].m_data[2] = 0.0;
    retVal.m_data.m_data[1].m_data[3] = 0.0;
    puVar6 = &sr::(anonymous_namespace)::s_constInMat2x4;
    lVar5 = 0;
    do {
      lVar8 = 0;
      do {
        *(undefined4 *)((long)pfVar2 + lVar8 * 4) = *(undefined4 *)((long)puVar6 + lVar8);
        lVar8 = lVar8 + 4;
      } while (lVar8 == 4);
      lVar5 = lVar5 + 1;
      pfVar2 = (float *)((long)pfVar2 + 4);
      puVar6 = puVar6 + 2;
    } while (lVar5 != 4);
  }
  puVar3 = &uStack_48;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar5 = 0;
    lVar8 = 0;
    do {
      lVar9 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar5 != lVar9) {
          uVar10 = 0;
        }
        *(undefined4 *)((long)puVar3 + lVar9) = uVar10;
        lVar9 = lVar9 + 0x10;
      } while (lVar9 == 0x10);
      lVar8 = lVar8 + 1;
      puVar3 = (undefined8 *)((long)puVar3 + 4);
      lVar5 = lVar5 + 0x10;
    } while (lVar8 != 4);
    uStack_48 = *(undefined8 *)evalCtx->in[0].m_data;
    retVal.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    retVal.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    retVal.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  }
  else {
    retVal.m_data.m_data[0].m_data[2] = 0.0;
    retVal.m_data.m_data[0].m_data[3] = 0.0;
    retVal.m_data.m_data[1].m_data[0] = 0.0;
    retVal.m_data.m_data[1].m_data[1] = 0.0;
    uStack_48 = 0;
    retVal.m_data.m_data[0].m_data[0] = 0.0;
    retVal.m_data.m_data[0].m_data[1] = 0.0;
    puVar6 = &DAT_00b4c2e0;
    lVar5 = 0;
    do {
      lVar8 = 0;
      do {
        *(undefined4 *)((long)puVar3 + lVar8 * 4) = *(undefined4 *)((long)puVar6 + lVar8);
        lVar8 = lVar8 + 4;
      } while (lVar8 == 4);
      lVar5 = lVar5 + 1;
      puVar3 = (undefined8 *)((long)puVar3 + 4);
      puVar6 = puVar6 + 2;
    } while (lVar5 != 4);
  }
  ppVVar4 = &local_68;
  fStack_54 = 0.0;
  fStack_50 = 0.0;
  local_68 = (Vec4 *)0x0;
  uStack_60 = 0;
  lVar5 = 0;
  lVar8 = 0;
  do {
    lVar9 = 0;
    do {
      uVar10 = 0x3f800000;
      if (lVar5 != lVar9) {
        uVar10 = 0;
      }
      *(undefined4 *)((long)ppVVar4 + lVar9) = uVar10;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 == 0x10);
    lVar8 = lVar8 + 1;
    ppVVar4 = (Vec4 **)((long)ppVVar4 + 4);
    lVar5 = lVar5 + 0x10;
  } while (lVar8 != 4);
  ppVVar4 = &local_68;
  puVar3 = &uStack_48;
  lVar5 = 0;
  do {
    lVar8 = 0;
    do {
      *(float *)((long)ppVVar4 + lVar8) =
           *(float *)((long)pfVar7 + lVar8) * *(float *)((long)puVar3 + lVar8);
      lVar8 = lVar8 + 0x10;
    } while (lVar8 == 0x10);
    lVar5 = lVar5 + 1;
    ppVVar4 = (Vec4 **)((long)ppVVar4 + 4);
    puVar3 = (undefined8 *)((long)puVar3 + 4);
    pfVar7 = (float *)((long)pfVar7 + 4);
  } while (lVar5 != 4);
  local_90 = local_68;
  local_88[0] = (undefined4)uStack_60;
  res.m_data[1] = fStack_54;
  res.m_data[2] = fStack_50;
  afStack_a8[2] = 0.0;
  afStack_a8[3] = 0.0;
  afStack_a8[4] = 0.0;
  lVar5 = 0;
  do {
    afStack_a8[lVar5 + 2] = *(float *)((long)&local_90 + lVar5 * 4) + res.m_data[lVar5 + 1];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_90 = &evalCtx->color;
  local_88[0] = 0;
  local_88[1] = 1;
  local_88[2] = 2;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_90 + lVar5 * 4)] = afStack_a8[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}